

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitSampledRGB(VP8Io *io,WebPDecParams *p)

{
  uint *puVar1;
  int unaff_EBX;
  undefined8 *in_RSI;
  long in_RDI;
  WebPSamplerRowFunc unaff_R14;
  uint8_t *dst;
  WebPRGBABuffer *buf;
  WebPDecBuffer *output;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  
  puVar1 = (uint *)*in_RSI;
  WebPSamplerProcessPlane
            ((uint8_t *)(puVar1 + 4),
             (int)((ulong)(*(long *)(puVar1 + 4) + (long)*(int *)(in_RDI + 8) * (long)(int)puVar1[6]
                          ) >> 0x20),(uint8_t *)WebPSamplers[*puVar1],
             (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,*(undefined4 *)(in_RDI + 0x10)),
             in_stack_ffffffffffffffb4,(uint8_t *)CONCAT44(in_stack_ffffffffffffffac,puVar1[6]),
             (int)in_RSI,(int)in_RDI,unaff_EBX,unaff_R14);
  return *(int *)(in_RDI + 0x10);
}

Assistant:

static int EmitSampledRGB(const VP8Io* const io, WebPDecParams* const p) {
  WebPDecBuffer* const output = p->output;
  WebPRGBABuffer* const buf = &output->u.RGBA;
  uint8_t* const dst = buf->rgba + (size_t)io->mb_y * buf->stride;
  WebPSamplerProcessPlane(io->y, io->y_stride,
                          io->u, io->v, io->uv_stride,
                          dst, buf->stride, io->mb_w, io->mb_h,
                          WebPSamplers[output->colorspace]);
  return io->mb_h;
}